

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktxinfo.cpp
# Opt level: O0

int __thiscall ktxInfo::main(ktxInfo *this,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  reference pbVar3;
  ostream *poVar4;
  int *piVar5;
  char *pcVar6;
  long in_RDI;
  ktx_error_code_e result;
  string infile;
  const_iterator it;
  int exitCode;
  FILE *inf;
  string *in_stack_fffffffffffffde8;
  string *in_stack_fffffffffffffdf0;
  ostream *in_stack_fffffffffffffdf8;
  ostream *in_stack_fffffffffffffe20;
  ostream *in_stack_fffffffffffffe28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe30;
  int local_140;
  allocator<char> local_139;
  string local_138 [38];
  byte local_112;
  allocator<char> local_111;
  string local_110 [8];
  OutfilePos in_stack_fffffffffffffef8;
  StdinUse in_stack_fffffffffffffefc;
  undefined8 in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff0c;
  undefined6 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff16;
  byte bVar7;
  allocator<char> in_stack_ffffffffffffff17;
  string local_e8 [38];
  byte local_c2;
  allocator<char> local_c1;
  string local_c0 [32];
  int local_a0;
  allocator<char> local_89;
  string local_88 [32];
  string local_68 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_30;
  int local_24;
  FILE *local_20;
  
  local_24 = 0;
  ktxApp::processCommandLine
            ((ktxApp *)
             CONCAT17(in_stack_ffffffffffffff17,
                      CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)),
             in_stack_ffffffffffffff0c,(char **)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
             in_stack_fffffffffffffef8);
  __gnu_cxx::
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::__normal_iterator(&local_30);
  local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffde8);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffffdf0,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffffde8);
  local_30._M_current = local_38;
  while( true ) {
    local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffde8);
    bVar1 = __gnu_cxx::operator<
                      ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffdf0,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffde8);
    if (!bVar1) {
      return local_24;
    }
    pbVar3 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_30);
    std::__cxx11::string::string(local_68,(string *)pbVar3);
    iVar2 = std::__cxx11::string::compare((char *)local_68);
    if (iVar2 == 0) {
      local_20 = _stdin;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe30,(char *)in_stack_fffffffffffffe28,
                 (allocator<char> *)in_stack_fffffffffffffe20);
      local_20 = fopenUTF8(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
      std::__cxx11::string::~string(local_88);
      std::allocator<char>::~allocator(&local_89);
    }
    if (local_20 == (FILE *)0x0) {
      poVar4 = std::operator<<((ostream *)&std::cerr,(string *)(in_RDI + 8));
      poVar4 = std::operator<<(poVar4," could not open input file \"");
      iVar2 = std::__cxx11::string::compare((char *)local_68);
      if (iVar2 == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffe30,(char *)in_stack_fffffffffffffe28,
                   (allocator<char> *)in_stack_fffffffffffffe20);
      }
      else {
        std::__cxx11::string::string(local_138,local_68);
      }
      in_stack_fffffffffffffdf8 = std::operator<<(poVar4,local_138);
      in_stack_fffffffffffffdf0 = (string *)std::operator<<(in_stack_fffffffffffffdf8,"\". ");
      piVar5 = __errno_location();
      pcVar6 = strerror(*piVar5);
      in_stack_fffffffffffffde8 =
           (string *)std::operator<<((ostream *)in_stack_fffffffffffffdf0,pcVar6);
      std::ostream::operator<<
                ((ostream *)in_stack_fffffffffffffde8,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_138);
      if (iVar2 == 0) {
        std::allocator<char>::~allocator(&local_139);
      }
      local_24 = 2;
      local_140 = 5;
    }
    else {
      local_a0 = ktxPrintInfoForStdioStream(local_20);
      if (local_a0 == 7) {
        poVar4 = std::operator<<((ostream *)&std::cerr,(string *)(in_RDI + 8));
        poVar4 = std::operator<<(poVar4,": Unexpected end of file reading \"");
        iVar2 = std::__cxx11::string::compare((char *)local_68);
        local_c2 = 0;
        if (iVar2 == 0) {
          std::allocator<char>::allocator();
          local_c2 = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffe30,(char *)in_stack_fffffffffffffe28,
                     (allocator<char> *)in_stack_fffffffffffffe20);
        }
        else {
          std::__cxx11::string::string(local_c0,local_68);
        }
        poVar4 = std::operator<<(poVar4,local_c0);
        poVar4 = std::operator<<(poVar4,"\".");
        std::ostream::operator<<((ostream *)poVar4,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_c0);
        if ((local_c2 & 1) != 0) {
          std::allocator<char>::~allocator(&local_c1);
        }
        local_24 = 2;
        local_140 = 5;
      }
      else if (local_a0 == 0xf) {
        poVar4 = std::operator<<((ostream *)&std::cerr,(string *)(in_RDI + 8));
        poVar4 = std::operator<<(poVar4,": ");
        iVar2 = std::__cxx11::string::compare((char *)local_68);
        bVar7 = 0;
        if (iVar2 == 0) {
          std::allocator<char>::allocator();
          bVar7 = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffe30,(char *)in_stack_fffffffffffffe28,
                     (allocator<char> *)in_stack_fffffffffffffe20);
        }
        else {
          std::__cxx11::string::string(local_e8,local_68);
        }
        poVar4 = std::operator<<(poVar4,local_e8);
        poVar4 = std::operator<<(poVar4," is not a KTX or KTX2 file.");
        std::ostream::operator<<((ostream *)poVar4,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_e8);
        if ((bVar7 & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff17);
        }
        local_24 = 2;
        local_140 = 5;
      }
      else if (local_a0 == 5) {
        poVar4 = std::operator<<((ostream *)&std::cerr,(string *)(in_RDI + 8));
        poVar4 = std::operator<<(poVar4,": Error reading \"");
        iVar2 = std::__cxx11::string::compare((char *)local_68);
        local_112 = 0;
        if (iVar2 == 0) {
          in_stack_fffffffffffffe30 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_111;
          std::allocator<char>::allocator();
          local_112 = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffe30,(char *)in_stack_fffffffffffffe28,
                     (allocator<char> *)in_stack_fffffffffffffe20);
        }
        else {
          std::__cxx11::string::string(local_110,local_68);
        }
        in_stack_fffffffffffffe28 = std::operator<<(poVar4,local_110);
        in_stack_fffffffffffffe20 = std::operator<<(in_stack_fffffffffffffe28,"\".");
        piVar5 = __errno_location();
        pcVar6 = strerror(*piVar5);
        poVar4 = std::operator<<(in_stack_fffffffffffffe20,pcVar6);
        std::ostream::operator<<((ostream *)poVar4,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_110);
        if ((local_112 & 1) != 0) {
          std::allocator<char>::~allocator(&local_111);
        }
        local_24 = 2;
        local_140 = 5;
      }
      else {
        local_140 = 0;
      }
    }
    std::__cxx11::string::~string(local_68);
    if (local_140 != 0) break;
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffffdf8,(int)((ulong)in_stack_fffffffffffffdf0 >> 0x20));
  }
  return local_24;
}

Assistant:

int
ktxInfo::main(int argc, char* argv[])
{
    FILE *inf;
    int exitCode = 0;

    processCommandLine(argc, argv);

    std::vector<string>::const_iterator it;
    for (it = options.infiles.begin(); it < options.infiles.end(); it++) {
       string infile = *it;

        if (!infile.compare("-")) {
            inf = stdin;
#if defined(_WIN32)
            /* Set "stdin" to have binary mode */
            (void)_setmode( _fileno( stdin ), _O_BINARY );
#endif
        } else {
            inf = fopenUTF8(infile, "rb");
        }

        if (inf) {
            KTX_error_code result;

            result = ktxPrintInfoForStdioStream(inf);
            if (result ==  KTX_FILE_UNEXPECTED_EOF) {
                cerr << name
                     << ": Unexpected end of file reading \""
                     << (infile.compare("-") ? infile : "stdin" ) << "\"."
                     << endl;
                exitCode = 2;
                goto cleanup;
            }
            if (result == KTX_UNKNOWN_FILE_FORMAT) {
                cerr << name
                     << ": " << (infile.compare("-") ? infile : "stdin")
                     << " is not a KTX or KTX2 file."
                     << endl;
                exitCode = 2;
                goto cleanup;
            }
            if (result == KTX_FILE_READ_ERROR) {
                cerr << name
                    << ": Error reading \""
                    << (infile.compare("-") ? infile : "stdin") << "\"."
                    << strerror(errno) << endl;
                exitCode = 2;
                goto cleanup;
            }
        } else {
            cerr << name
                 << " could not open input file \""
                 << (infile.compare("-") ? infile : "stdin") << "\". "
                 << strerror(errno) << endl;
            exitCode = 2;
            goto cleanup;
        }
    }

cleanup:
    return exitCode;
}